

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O3

xmlElementPtr
xmlAddElementDecl(xmlValidCtxtPtr ctxt,xmlDtdPtr dtd,xmlChar *name,xmlElementTypeVal type,
                 xmlElementContentPtr content)

{
  _xmlDtd *p_Var1;
  _xmlNode *p_Var2;
  xmlChar *key2;
  int iVar3;
  xmlChar *key;
  xmlHashTablePtr hash;
  xmlElementPtr elem;
  _xmlNode *elem_00;
  xmlChar *pxVar4;
  xmlElementContentPtr pxVar5;
  xmlParserErrors code;
  _xmlDict *dict;
  char *msg;
  xmlChar *prefix;
  xmlValidCtxtPtr local_48;
  xmlAttributePtr local_40;
  xmlHashTablePtr local_38;
  
  prefix = (xmlChar *)0x0;
  if (name == (xmlChar *)0x0 || dtd == (xmlDtdPtr)0x0) {
    return (xmlElementPtr)0x0;
  }
  switch(type) {
  case XML_ELEMENT_TYPE_EMPTY:
    if (content == (xmlElementContentPtr)0x0) {
LAB_001546c4:
      key = xmlSplitQName4(name,&prefix);
      if (key != (xmlChar *)0x0) {
        hash = (xmlHashTablePtr)dtd->elements;
        local_48 = ctxt;
        if (hash == (xmlHashTablePtr)0x0) {
          if (dtd->doc == (_xmlDoc *)0x0) {
            dict = (xmlDictPtr)0x0;
          }
          else {
            dict = dtd->doc->dict;
          }
          hash = xmlHashCreateDict(0,dict);
          ctxt = local_48;
          if (hash == (xmlHashTablePtr)0x0) goto LAB_001549c6;
          dtd->elements = hash;
        }
        if ((dtd->doc == (_xmlDoc *)0x0) || (p_Var1 = dtd->doc->intSubset, p_Var1 == (_xmlDtd *)0x0)
           ) {
          local_40 = (xmlAttributePtr)0x0;
        }
        else {
          local_38 = hash;
          elem = (xmlElementPtr)xmlHashLookup2((xmlHashTablePtr)p_Var1->elements,key,prefix);
          if ((elem == (xmlElementPtr)0x0) || (elem->etype != XML_ELEMENT_TYPE_UNDEFINED)) {
            local_40 = (xmlAttributePtr)0x0;
            hash = local_38;
          }
          else {
            local_40 = elem->attributes;
            elem->attributes = (xmlAttributePtr)0x0;
            xmlHashRemoveEntry2((xmlHashTablePtr)dtd->doc->intSubset->elements,key,prefix,
                                (xmlHashDeallocator)0x0);
            xmlFreeElement(elem);
            hash = local_38;
          }
        }
        elem_00 = (_xmlNode *)xmlHashLookup2(hash,key,prefix);
        ctxt = local_48;
        if (elem_00 == (_xmlNode *)0x0) {
          elem_00 = (_xmlNode *)(*xmlMalloc)(0x70);
          ctxt = local_48;
          if (elem_00 != (_xmlNode *)0x0) {
            elem_00->_private = (void *)0x0;
            *(undefined8 *)&elem_00->type = 0;
            elem_00->nsDef = (xmlNs *)0x0;
            elem_00->psvi = (void *)0x0;
            elem_00->content = (xmlChar *)0x0;
            elem_00->properties = (_xmlAttr *)0x0;
            elem_00->doc = (_xmlDoc *)0x0;
            elem_00->ns = (xmlNs *)0x0;
            elem_00->next = (_xmlNode *)0x0;
            elem_00->prev = (_xmlNode *)0x0;
            elem_00->last = (_xmlNode *)0x0;
            elem_00->parent = (_xmlNode *)0x0;
            elem_00->name = (xmlChar *)0x0;
            elem_00->children = (_xmlNode *)0x0;
            elem_00->type = XML_ELEMENT_DECL;
            pxVar4 = xmlStrdup(key);
            key2 = prefix;
            elem_00->name = pxVar4;
            if (pxVar4 == (xmlChar *)0x0) {
              (*xmlFree)(elem_00);
              ctxt = local_48;
            }
            else {
              elem_00->nsDef = (xmlNs *)prefix;
              prefix = (xmlChar *)0x0;
              iVar3 = xmlHashAdd2(hash,key,key2,elem_00);
              if (0 < iVar3) {
                elem_00->properties = (_xmlAttr *)local_40;
                ctxt = local_48;
                goto LAB_00154930;
              }
              xmlFreeElement((xmlElementPtr)elem_00);
              ctxt = local_48;
            }
          }
        }
        else {
          if (*(int *)&elem_00->ns != 0) {
            xmlDoErrValid(local_48,(xmlNodePtr)dtd,XML_DTD_ELEM_REDEFINED,2,name,(xmlChar *)0x0,
                          (xmlChar *)0x0,0,"Redefinition of element %s\n",name,0,0);
            if (prefix == (xmlChar *)0x0) {
              return (xmlElementPtr)0x0;
            }
            goto LAB_001549dc;
          }
          if (prefix != (xmlChar *)0x0) {
            (*xmlFree)(prefix);
            prefix = (xmlChar *)0x0;
          }
LAB_00154930:
          *(xmlElementTypeVal *)&elem_00->ns = type;
          if (content == (xmlElementContentPtr)0x0) {
LAB_00154976:
            elem_00->parent = (_xmlNode *)dtd;
            elem_00->doc = dtd->doc;
            p_Var2 = dtd->last;
            if (p_Var2 == (_xmlNode *)0x0) {
              dtd->children = elem_00;
            }
            else {
              p_Var2->next = elem_00;
              elem_00->prev = p_Var2;
            }
            dtd->last = elem_00;
            if (prefix != (xmlChar *)0x0) {
              (*xmlFree)(prefix);
              return (xmlElementPtr)elem_00;
            }
            return (xmlElementPtr)elem_00;
          }
          if ((ctxt != (xmlValidCtxtPtr)0x0) && ((ctxt->flags & 2) != 0)) {
            elem_00->content = (xmlChar *)content;
            content->parent = (_xmlElementContent *)&DAT_00000001;
            goto LAB_00154976;
          }
          pxVar5 = xmlCopyDocElementContent(dtd->doc,content);
          elem_00->content = (xmlChar *)pxVar5;
          if (pxVar5 != (xmlElementContentPtr)0x0) goto LAB_00154976;
        }
      }
LAB_001549c6:
      xmlVErrMemory(ctxt);
      if (prefix == (xmlChar *)0x0) {
        return (xmlElementPtr)0x0;
      }
LAB_001549dc:
      (*xmlFree)(prefix);
      return (xmlElementPtr)0x0;
    }
    msg = "xmlAddElementDecl: content != NULL for EMPTY\n";
    break;
  case XML_ELEMENT_TYPE_ANY:
    if (content == (xmlElementContentPtr)0x0) goto LAB_001546c4;
    msg = "xmlAddElementDecl: content != NULL for ANY\n";
    break;
  case XML_ELEMENT_TYPE_MIXED:
    if (content != (xmlElementContentPtr)0x0) goto LAB_001546c4;
    msg = "xmlAddElementDecl: content == NULL for MIXED\n";
    break;
  case XML_ELEMENT_TYPE_ELEMENT:
    if (content != (xmlElementContentPtr)0x0) goto LAB_001546c4;
    msg = "xmlAddElementDecl: content == NULL for ELEMENT\n";
    break;
  default:
    msg = "xmlAddElementDecl: invalid type\n";
    code = XML_ERR_ARGUMENT;
    goto LAB_00154711;
  }
  code = XML_DTD_CONTENT_ERROR;
LAB_00154711:
  xmlDoErrValid(ctxt,(xmlNodePtr)0x0,code,2,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,msg,0);
  return (xmlElementPtr)0x0;
}

Assistant:

xmlElementPtr
xmlAddElementDecl(xmlValidCtxtPtr ctxt,
                  xmlDtdPtr dtd, const xmlChar *name,
                  xmlElementTypeVal type,
		  xmlElementContentPtr content) {
    xmlElementPtr ret;
    xmlElementTablePtr table;
    xmlAttributePtr oldAttributes = NULL;
    const xmlChar *localName;
    xmlChar *prefix = NULL;

    if (dtd == NULL) {
	return(NULL);
    }
    if (name == NULL) {
	return(NULL);
    }

    switch (type) {
        case XML_ELEMENT_TYPE_EMPTY:
	    if (content != NULL) {
		xmlErrValid(ctxt, XML_DTD_CONTENT_ERROR,
		        "xmlAddElementDecl: content != NULL for EMPTY\n",
			NULL);
		return(NULL);
	    }
	    break;
	case XML_ELEMENT_TYPE_ANY:
	    if (content != NULL) {
		xmlErrValid(ctxt, XML_DTD_CONTENT_ERROR,
		        "xmlAddElementDecl: content != NULL for ANY\n",
			NULL);
		return(NULL);
	    }
	    break;
	case XML_ELEMENT_TYPE_MIXED:
	    if (content == NULL) {
		xmlErrValid(ctxt, XML_DTD_CONTENT_ERROR,
		        "xmlAddElementDecl: content == NULL for MIXED\n",
			NULL);
		return(NULL);
	    }
	    break;
	case XML_ELEMENT_TYPE_ELEMENT:
	    if (content == NULL) {
		xmlErrValid(ctxt, XML_DTD_CONTENT_ERROR,
		        "xmlAddElementDecl: content == NULL for ELEMENT\n",
			NULL);
		return(NULL);
	    }
	    break;
	default:
	    xmlErrValid(ctxt, XML_ERR_ARGUMENT,
		    "xmlAddElementDecl: invalid type\n", NULL);
	    return(NULL);
    }

    /*
     * check if name is a QName
     */
    localName = xmlSplitQName4(name, &prefix);
    if (localName == NULL)
        goto mem_error;

    /*
     * Create the Element table if needed.
     */
    table = (xmlElementTablePtr) dtd->elements;
    if (table == NULL) {
	xmlDictPtr dict = NULL;

	if (dtd->doc != NULL)
	    dict = dtd->doc->dict;
        table = xmlHashCreateDict(0, dict);
        if (table == NULL)
            goto mem_error;
	dtd->elements = (void *) table;
    }

    /*
     * lookup old attributes inserted on an undefined element in the
     * internal subset.
     */
    if ((dtd->doc != NULL) && (dtd->doc->intSubset != NULL)) {
	ret = xmlHashLookup2(dtd->doc->intSubset->elements, localName, prefix);
	if ((ret != NULL) && (ret->etype == XML_ELEMENT_TYPE_UNDEFINED)) {
	    oldAttributes = ret->attributes;
	    ret->attributes = NULL;
	    xmlHashRemoveEntry2(dtd->doc->intSubset->elements, localName, prefix,
                                NULL);
	    xmlFreeElement(ret);
	}
    }

    /*
     * The element may already be present if one of its attribute
     * was registered first
     */
    ret = xmlHashLookup2(table, localName, prefix);
    if (ret != NULL) {
	if (ret->etype != XML_ELEMENT_TYPE_UNDEFINED) {
#ifdef LIBXML_VALID_ENABLED
	    /*
	     * The element is already defined in this DTD.
	     */
	    xmlErrValidNode(ctxt, (xmlNodePtr) dtd, XML_DTD_ELEM_REDEFINED,
	                    "Redefinition of element %s\n",
			    name, NULL, NULL);
#endif /* LIBXML_VALID_ENABLED */
            if (prefix != NULL)
	        xmlFree(prefix);
	    return(NULL);
	}
	if (prefix != NULL) {
	    xmlFree(prefix);
	    prefix = NULL;
	}
    } else {
        int res;

	ret = (xmlElementPtr) xmlMalloc(sizeof(xmlElement));
	if (ret == NULL)
            goto mem_error;
	memset(ret, 0, sizeof(xmlElement));
	ret->type = XML_ELEMENT_DECL;

	/*
	 * fill the structure.
	 */
	ret->name = xmlStrdup(localName);
	if (ret->name == NULL) {
	    xmlFree(ret);
	    goto mem_error;
	}
	ret->prefix = prefix;
        prefix = NULL;

	/*
	 * Validity Check:
	 * Insertion must not fail
	 */
        res = xmlHashAdd2(table, localName, ret->prefix, ret);
        if (res <= 0) {
	    xmlFreeElement(ret);
            goto mem_error;
	}
	/*
	 * For new element, may have attributes from earlier
	 * definition in internal subset
	 */
	ret->attributes = oldAttributes;
    }

    /*
     * Finish to fill the structure.
     */
    ret->etype = type;
    /*
     * Avoid a stupid copy when called by the parser
     * and flag it by setting a special parent value
     * so the parser doesn't unallocate it.
     */
    if (content != NULL) {
        if ((ctxt != NULL) && (ctxt->flags & XML_VCTXT_USE_PCTXT)) {
            ret->content = content;
            content->parent = (xmlElementContentPtr) 1;
        } else if (content != NULL){
            ret->content = xmlCopyDocElementContent(dtd->doc, content);
            if (ret->content == NULL)
                goto mem_error;
        }
    }

    /*
     * Link it to the DTD
     */
    ret->parent = dtd;
    ret->doc = dtd->doc;
    if (dtd->last == NULL) {
	dtd->children = dtd->last = (xmlNodePtr) ret;
    } else {
        dtd->last->next = (xmlNodePtr) ret;
	ret->prev = dtd->last;
	dtd->last = (xmlNodePtr) ret;
    }
    if (prefix != NULL)
	xmlFree(prefix);
    return(ret);

mem_error:
    xmlVErrMemory(ctxt);
    if (prefix != NULL)
        xmlFree(prefix);
    return(NULL);
}